

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTest.cpp
# Opt level: O2

void __thiscall
oout::NamedTest::NamedTest
          (NamedTest *this,string *name,
          list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
          *tests)

{
  undefined1 local_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  std::
  make_shared<oout::SuiteTest_const,std::__cxx11::list<std::shared_ptr<oout::Test_const>,std::allocator<std::shared_ptr<oout::Test_const>>>const&>
            ((list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              *)local_48);
  local_48._16_8_ = local_48._0_8_;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_;
  local_48._0_8_ = (_List_node_base *)0x0;
  local_48._8_8_ = (_List_node_base *)0x0;
  NamedTest(this,name,(shared_ptr<const_oout::Test> *)(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return;
}

Assistant:

NamedTest::NamedTest(const string &name, const list<shared_ptr<const Test>> &tests)
	: NamedTest(name, make_shared<const SuiteTest>(tests))
{
}